

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBox::setModel(QComboBox *this,QAbstractItemModel *model)

{
  QComboBoxPrivate *this_00;
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  long *plVar3;
  void **ppvVar4;
  QCompleter *pQVar5;
  QItemSelectionModel *pQVar6;
  undefined4 *puVar7;
  long lVar8;
  long in_FS_OFFSET;
  code *local_68;
  quintptr local_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_58;
  Connection local_50;
  code *local_48;
  ImplFn local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (model == (QAbstractItemModel *)0x0) {
    setModel();
  }
  else {
    this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
    if (this_00->model != model) {
      if (this_00->lineEdit != (QLineEdit *)0x0) {
        pQVar5 = QLineEdit::completer(this_00->lineEdit);
        if (pQVar5 != (QCompleter *)0x0) {
          pQVar5 = QLineEdit::completer(this_00->lineEdit);
          QCompleter::setModel(pQVar5,model);
        }
      }
      lVar8 = 600;
      do {
        QObject::disconnect((Connection *)
                            (&(this_00->super_QWidgetPrivate).super_QObjectPrivate + lVar8));
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x298);
      pQVar1 = this_00->model;
      if ((pQVar1 != (QAbstractItemModel *)0x0) &&
         (*(QComboBox **)(*(long *)(pQVar1 + 8) + 0x10) == this)) {
        (**(code **)(*(long *)pQVar1 + 0x20))();
        this_00->model = (QAbstractItemModel *)0x0;
      }
      this_00->model = model;
      pDVar2 = (this_00->container).wp.d;
      if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
         ((this_00->container).wp.value != (QObject *)0x0)) {
        plVar3 = *(long **)((this_00->container).wp.value + 0x50);
        (**(code **)(*plVar3 + 0x1c8))(plVar3,model);
        pQVar6 = QAbstractItemView::selectionModel
                           (*(QAbstractItemView **)((this_00->container).wp.value + 0x50));
        local_68 = QItemSelectionModel::currentChanged;
        local_60 = 0;
        local_48 = QComboBoxPrivate::emitHighlighted;
        local_40 = (ImplFn)0x0;
        ppvVar4 = *(void ***)&(this_00->super_QWidgetPrivate).field_0x8;
        puVar7 = (undefined4 *)operator_new(0x20);
        *puVar7 = 1;
        *(code **)(puVar7 + 2) =
             QtPrivate::
             QPrivateSlotObject<void_(QComboBoxPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
             ::impl;
        *(code **)(puVar7 + 4) = QComboBoxPrivate::emitHighlighted;
        *(undefined8 *)(puVar7 + 6) = 0;
        QObject::connectImpl
                  ((QObject *)&local_50,(void **)pQVar6,(QObject *)&local_68,ppvVar4,
                   (QSlotObjectBase *)&local_48,(ConnectionType)puVar7,(int *)0x80,
                   (QMetaObject *)0x0);
        QMetaObject::Connection::~Connection(&local_50);
      }
      QComboBoxPrivate::connectModel(this_00);
      local_68 = (code *)0xffffffffffffffff;
      local_60 = 0;
      tStack_58.ptr = (QAbstractItemModel *)0x0;
      setRootModelIndex(this,(QModelIndex *)&local_68);
      QComboBoxPrivate::trySetValidIndex(this_00);
      QComboBoxPrivate::modelChanged(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setModel(QAbstractItemModel *model)
{
    Q_D(QComboBox);

    if (Q_UNLIKELY(!model)) {
        qWarning("QComboBox::setModel: cannot set a 0 model");
        return;
    }

    if (model == d->model)
        return;

#if QT_CONFIG(completer)
    if (d->lineEdit && d->lineEdit->completer())
        d->lineEdit->completer()->setModel(model);
#endif
    d->disconnectModel();
    if (d->model && d->model->QObject::parent() == this) {
        delete d->model;
        d->model = nullptr;
    }

    d->model = model;

    if (d->container) {
        d->container->itemView()->setModel(model);
        QObjectPrivate::connect(d->container->itemView()->selectionModel(),
                                &QItemSelectionModel::currentChanged,
                                d, &QComboBoxPrivate::emitHighlighted, Qt::UniqueConnection);
    }

    d->connectModel();

    setRootModelIndex(QModelIndex());

    d->trySetValidIndex();
    d->modelChanged();
}